

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::Data
          (Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *this,
          Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *pNVar6;
  long lVar7;
  size_t sVar8;
  uchar *puVar9;
  size_t sVar10;
  R RVar11;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar8 = other->numBuckets;
  sVar10 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar10;
  this->spans = (Span *)0x0;
  RVar11 = allocateSpans(sVar8);
  this->spans = (Span *)RVar11.spans;
  if (RVar11.nSpans != 0) {
    lVar7 = 0;
    sVar8 = 0;
    do {
      pSVar2 = other->spans;
      sVar10 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar10 + lVar7];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar8].entries;
          pNVar6 = Span<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::
                   insert(this->spans + sVar8,sVar10);
          puVar9 = (pEVar3->storage).data + (uint)bVar1 * 0x30;
          pNVar6->key = *(ControlPixmap *)puVar9;
          QPixmap::QPixmap(&(pNVar6->value).pixmap,(QPixmap *)(puVar9 + 8));
          uVar4 = *(undefined8 *)(puVar9 + 0x20);
          uVar5 = *(undefined8 *)(puVar9 + 0x28);
          (pNVar6->value).margins.m_left = (Representation)(int)uVar4;
          (pNVar6->value).margins.m_top = (Representation)(int)((ulong)uVar4 >> 0x20);
          (pNVar6->value).margins.m_right = (Representation)(int)uVar5;
          (pNVar6->value).margins.m_bottom = (Representation)(int)((ulong)uVar5 >> 0x20);
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != 0x80);
      sVar8 = sVar8 + 1;
      lVar7 = lVar7 + 0x90;
    } while (sVar8 != RVar11.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }